

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

bool __thiscall sortfun::operator()(sortfun *this,sortitem *xval,sortitem *yval)

{
  ident *piVar1;
  uint *puVar2;
  bool bVar3;
  
  if ((this->x->field_2).minval != 6) {
    (this->x->field_2).minval = 6;
  }
  piVar1 = this->x;
  puVar2 = (piVar1->field_3).code;
  if (puVar2 != (uint *)0x0) {
    *puVar2 = *puVar2 - 0x100;
    if ((int)*(piVar1->field_3).code < 0x100) {
      operator_delete__((piVar1->field_3).code);
    }
    (piVar1->field_3).code = (uint *)0x0;
  }
  this->x->field_4 = (anon_union_8_3_558327c1_for_ident_6)xval->str;
  if ((this->y->field_2).minval != 6) {
    (this->y->field_2).minval = 6;
  }
  piVar1 = this->y;
  puVar2 = (piVar1->field_3).code;
  if (puVar2 != (uint *)0x0) {
    *puVar2 = *puVar2 - 0x100;
    if ((int)*(piVar1->field_3).code < 0x100) {
      operator_delete__((piVar1->field_3).code);
    }
    (piVar1->field_3).code = (uint *)0x0;
  }
  (this->y->field_4).val.field_0 = (anon_union_8_5_08252708_for_identval_0)yval->str;
  bVar3 = executebool(this->body);
  return bVar3;
}

Assistant:

bool operator()(const sortitem &xval, const sortitem &yval)
    {
        if(x->valtype != VAL_MACRO) x->valtype = VAL_MACRO;
        cleancode(*x);
        x->val.code = (const uint *)xval.str;
        if(y->valtype != VAL_MACRO) y->valtype = VAL_MACRO;
        cleancode(*y);
        y->val.code = (const uint *)yval.str;
        return executebool(body);
    }